

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffreopen(fitsfile *openfptr,fitsfile **newfptr,int *status)

{
  void *pvVar1;
  int *in_RDX;
  long *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    if (in_RDI == 0) {
      *in_RDX = 0x73;
      local_4 = 0x73;
    }
    else if (*(int *)(*(long *)(in_RDI + 8) + 0x18) == 0x22b) {
      pvVar1 = calloc(1,0x10);
      *in_RSI = (long)pvVar1;
      *(undefined8 *)(*in_RSI + 8) = *(undefined8 *)(in_RDI + 8);
      *(undefined4 *)*in_RSI = 0;
      *(int *)(*(long *)(*in_RSI + 8) + 8) = *(int *)(*(long *)(*in_RSI + 8) + 8) + 1;
      local_4 = *in_RDX;
    }
    else {
      *in_RDX = 0x72;
      local_4 = 0x72;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffreopen(fitsfile *openfptr, /* I - FITS file pointer to open file  */ 
             fitsfile **newfptr,  /* O - pointer to new re opened file   */
             int *status)        /* IO - error status                   */
/*
  Reopen an existing FITS file with either readonly or read/write access.
  The reopened file shares the same FITSfile structure but may point to a
  different HDU within the file.
*/
{
    if (*status > 0)
        return(*status);

    /* check that the open file pointer is valid */
    if (!openfptr)
        return(*status = NULL_INPUT_PTR);
    else if ((openfptr->Fptr)->validcode != VALIDSTRUC) /* check magic value */
        return(*status = BAD_FILEPTR); 

        /* allocate fitsfile structure and initialize = 0 */
    *newfptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    (*newfptr)->Fptr = openfptr->Fptr; /* both point to the same structure */
    (*newfptr)->HDUposition = 0;  /* set initial position to primary array */
    (((*newfptr)->Fptr)->open_count)++;   /* increment the file usage counter */

    return(*status);
}